

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.c
# Opt level: O1

void opj_thread_pool_wait_completion(opj_thread_pool_t *tp,int max_remaining_jobs)

{
  int iVar1;
  
  if ((pthread_mutex_t *)tp->mutex != (pthread_mutex_t *)0x0) {
    iVar1 = 0;
    if (0 < max_remaining_jobs) {
      iVar1 = max_remaining_jobs;
    }
    pthread_mutex_lock((pthread_mutex_t *)tp->mutex);
    tp->signaling_threshold = iVar1;
    while (iVar1 < tp->pending_jobs_count) {
      pthread_cond_wait((pthread_cond_t *)tp->cond,(pthread_mutex_t *)tp->mutex);
    }
    pthread_mutex_unlock((pthread_mutex_t *)tp->mutex);
    return;
  }
  return;
}

Assistant:

void opj_thread_pool_wait_completion(opj_thread_pool_t* tp,
                                     int max_remaining_jobs)
{
    if (tp->mutex == NULL) {
        return;
    }

    if (max_remaining_jobs < 0) {
        max_remaining_jobs = 0;
    }
    opj_mutex_lock(tp->mutex);
    tp->signaling_threshold = max_remaining_jobs;
    while (tp->pending_jobs_count > max_remaining_jobs) {
        /*printf("tp=%p, jobs before wait = %d, max_remaining_jobs = %d\n", tp, tp->pending_jobs_count, max_remaining_jobs);*/
        opj_cond_wait(tp->cond, tp->mutex);
        /*printf("tp=%p, jobs after wait = %d\n", tp, tp->pending_jobs_count);*/
    }
    opj_mutex_unlock(tp->mutex);
}